

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

uint __thiscall
duckdb::VectorDecimalCastOperator<duckdb::TryCastFromDecimal>::
Operation<duckdb::hugeint_t,unsigned_int>
          (VectorDecimalCastOperator<duckdb::TryCastFromDecimal> *this,hugeint_t input,
          ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  uint uVar2;
  hugeint_t input_00;
  uint result_value;
  uint8_t in_stack_ffffffffffffffb8;
  allocator local_45;
  uint local_44;
  string local_40;
  
  input_00.lower = input.lower;
  input_00.upper = (int64_t)&local_44;
  bVar1 = TryCastFromDecimal::Operation<duckdb::hugeint_t,unsigned_int>
                    ((TryCastFromDecimal *)this,input_00,*(uint32_t **)(idx + 8),
                     (CastParameters *)(ulong)*(byte *)(idx + 0x18),*(uint8_t *)(idx + 0x19),
                     in_stack_ffffffffffffffb8);
  if (!bVar1) {
    ::std::__cxx11::string::string((string *)&local_40,"Failed to cast decimal value",&local_45);
    uVar2 = HandleVectorCastError::Operation<unsigned_int>
                      (&local_40,(ValidityMask *)input.upper,(idx_t)mask,(VectorTryCastData *)idx);
    ::std::__cxx11::string::~string((string *)&local_40);
    local_44 = uVar2;
  }
  return local_44;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorDecimalCastData *>(dataptr);
		RESULT_TYPE result_value;
		if (!OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, result_value, data->vector_cast_data.parameters,
		                                                     data->width, data->scale)) {
			return HandleVectorCastError::Operation<RESULT_TYPE>("Failed to cast decimal value", mask, idx,
			                                                     data->vector_cast_data);
		}
		return result_value;
	}